

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

value * __thiscall
mjs::interpreter::impl::top_level_eval
          (value *__return_storage_ptr__,impl *this,statement *s,bool allow_return)

{
  object_ptr *error;
  wostream *os;
  native_error_exception *this_00;
  value *rhs;
  wstring_view local_238;
  wchar_t *local_228;
  size_t local_220;
  wstring local_208;
  completion c;
  wstring_view local_1a8;
  wostringstream woss;
  
  eval(&c,this,s);
  if (c.type == throw_) {
    if (c.result.type_ == object) {
      error = value::object_value(&c.result);
      rethrow_error(error);
    }
    __assert_fail("c.result.type() == value_type::object",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                  ,0x1ab,"value mjs::interpreter::impl::top_level_eval(const statement &, bool)");
  }
  if (allow_return && c.type == return_) {
    rhs = &c.result;
  }
  else {
    if (c.type != normal) {
      std::__cxx11::wostringstream::wostringstream((wostringstream *)&woss);
      os = std::operator<<((wostream *)&woss,"Top level evaluation resulted in abrupt termination: "
                          );
      mjs::operator<<(os,&c);
      this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
      stack_trace_abi_cxx11_(&local_208,this);
      local_238._M_len = local_208._M_string_length;
      local_238._M_str = local_208._M_dataplus._M_p;
      std::__cxx11::wstringbuf::str();
      local_1a8._M_len = local_220;
      local_1a8._M_str = local_228;
      native_error_exception::native_error_exception(this_00,eval,&local_238,&local_1a8);
      __cxa_throw(this_00,&native_error_exception::typeinfo,
                  native_error_exception::~native_error_exception);
    }
    rhs = (value *)&value::undefined;
  }
  value::value(__return_storage_ptr__,rhs);
  value::~value(&c.result);
  return __return_storage_ptr__;
}

Assistant:

value top_level_eval(const statement& s, bool allow_return = true) {
        auto c = eval(s);
        // ES3, 13.2.1 [[Call]]
        if (c.type == completion_type::throw_) {
            assert(c.result.type() == value_type::object);
            rethrow_error(c.result.object_value());
        } else if  (allow_return && c.type == completion_type::return_) {
            return c.result;
        } else if (!c) {
            // Don't let normal completion values escape
            return value::undefined;
        }
        std::wostringstream woss;
        woss << "Top level evaluation resulted in abrupt termination: " << c;
        throw native_error_exception(native_error_type::eval, stack_trace(), woss.str());
    }